

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

BlurNode * rengine::BlurNode::create(void)

{
  undefined1 *puVar1;
  BlurNode *pBVar2;
  
  if (__allocation_pool_rengine_BlurNode.m_nextFree < __allocation_pool_rengine_BlurNode.m_poolSize)
  {
    pBVar2 = AllocationPool<rengine::BlurNode>::allocate(&__allocation_pool_rengine_BlurNode);
    puVar1 = &(pBVar2->super_Node).field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    pBVar2 = (BlurNode *)operator_new(0x38);
    (pBVar2->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    (pBVar2->super_Node).m_parent = (Node *)0x0;
    (pBVar2->super_Node).m_child = (Node *)0x0;
    (pBVar2->super_Node).m_next = (Node *)0x0;
    (pBVar2->super_Node).m_prev = (Node *)0x0;
    *(undefined8 *)&(pBVar2->super_Node).field_0x30 = 0x300000004;
    (pBVar2->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)&PTR__Node_00115c60
    ;
  }
  return pBVar2;
}

Assistant:

static BlurNode *create(unsigned radius) {
        auto node = create();
        node->setRadius(radius);
        return node;
    }